

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerMorph::EndEffect(APowerMorph *this)

{
  int iVar1;
  player_t *ppVar2;
  AActor *pAVar3;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&(this->super_APowerup).super_AInventory.Owner);
  ppVar2 = this->Player;
  if (pAVar3 == (AActor *)0x0) {
    if (ppVar2 != (player_t *)0x0) {
      __assert_fail("Player == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_artifacts.cpp"
                    ,0x79f,"virtual void APowerMorph::EndEffect()");
    }
  }
  else if ((ppVar2 != (player_t *)0x0) && (0 < ppVar2->health)) {
    if (this->bNoCallUndoMorph == false) {
      iVar1 = ppVar2->morphTics;
      P_UndoPlayerMorph(ppVar2,ppVar2,0,(bool)((byte)((uint)ppVar2->MorphStyle >> 0xd) & 1));
      ppVar2 = this->Player;
      if ((ppVar2 != (player_t *)0x0) && (ppVar2->morphTics != 0)) {
        *(int *)&(this->super_APowerup).super_AInventory.field_0x4dc = ppVar2->morphTics;
        ppVar2->morphTics = iVar1;
        return;
      }
    }
    this->Player = (player_t *)0x0;
  }
  return;
}

Assistant:

void APowerMorph::EndEffect( )
{
	Super::EndEffect();

	// Abort if owner already destroyed
	if (Owner == NULL)
	{
		assert(Player == NULL);
		return;
	}
	
	// Abort if owner already unmorphed
	if (Player == NULL)
	{
		return;
	}

	// Abort if owner is dead; their Die() method will
	// take care of any required unmorphing on death.
	if (Player->health <= 0)
	{
		return;
	}

	// Unmorph if possible
	if (!bNoCallUndoMorph)
	{
		int savedMorphTics = Player->morphTics;
		P_UndoPlayerMorph (Player, Player, 0, !!(Player->MorphStyle & MORPH_UNDOALWAYS));

		// Abort if unmorph failed; in that case,
		// set the usual retry timer and return.
		if (Player != NULL && Player->morphTics)
		{
			// Transfer retry timeout
			// to the powerup's timer.
			EffectTics = Player->morphTics;
			// Reload negative morph tics;
			// use actual value; it may
			// be in use for animation.
			Player->morphTics = savedMorphTics;
			// Try again some time later
			return;
		}
	}
	// Unmorph suceeded
	Player = NULL;
}